

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O0

slab * slab_get_large(slab_cache *cache,size_t size)

{
  size_t sVar1;
  ssize_t sVar2;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  slab *slab;
  size_t size_local;
  slab_cache *cache_local;
  
  sVar1 = slab_sizeof();
  sVar1 = sVar1 + size;
  sVar2 = quota_use(cache->arena->quota,sVar1);
  if (sVar2 < 0) {
    cache_local = (slab_cache *)0x0;
  }
  else {
    cache_local = (slab_cache *)malloc(sVar1);
    if (cache_local == (slab_cache *)0x0) {
      quota_release(cache->arena->quota,sVar1);
      cache_local = (slab_cache *)0x0;
    }
    else {
      slab_create((slab *)cache_local,cache->order_max + '\x01',sVar1);
      ((rlist *)&cache_local->arena)->prev = &(cache->allocated).slabs;
      *(rlist **)&cache_local->order0_size = (cache->allocated).slabs.next;
      ((rlist *)&cache_local->arena)->prev->next = (rlist *)cache_local;
      (*(rlist **)&cache_local->order0_size)->prev = (rlist *)cache_local;
      (cache->allocated).stats.total =
           (cache_local->allocated).stats.used + (cache->allocated).stats.total;
      (cache->allocated).stats.used = sVar1 + (cache->allocated).stats.used;
      slab_data((slab *)cache_local);
      slab_capacity((slab *)cache_local);
    }
  }
  return (slab *)cache_local;
}

Assistant:

struct slab *
slab_get_large(struct slab_cache *cache, size_t size)
{
	size += slab_sizeof();
	if (quota_use(cache->arena->quota, size) < 0)
		return NULL;
	struct slab *slab = (struct slab *) malloc(size);
	if (slab == NULL) {
		quota_release(cache->arena->quota, size);
		return NULL;
	}

	slab_create(slab, cache->order_max + 1, size);
	slab_list_add(&cache->allocated, slab, next_in_cache);
	cache->allocated.stats.used += size;
	VALGRIND_MEMPOOL_ALLOC(cache, slab_data(slab),
			       slab_capacity(slab));
	return slab;
}